

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoxList.h
# Opt level: O2

Iterator __thiscall
axl::sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::insertTail
          (BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *this,Ptr<void> *value)

{
  BoxListEntry<axl::rc::Ptr<void>_> *p;
  Iterator IVar1;
  EVP_PKEY_CTX *src;
  
  p = (BoxListEntry<axl::rc::Ptr<void>_> *)operator_new(0x20);
  (p->m_value).m_p = (void *)0x0;
  (p->m_value).m_refCount = (RefCount *)0x0;
  rc::Ptr<void>::copy(&p->m_value,(EVP_PKEY_CTX *)value,src);
  IVar1 = ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
          ::insertTail((ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
                        *)this,p);
  return (Iterator)
         IVar1.
         super_BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
         .
         super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
         .m_p;
}

Assistant:

Iterator
	insertTail(ValueArg value) {
		Entry* entry = new Entry;
		entry->m_value = value;
		return insertTailEntry(entry);
	}